

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerPosixPipeConnection.cxx
# Opt level: O0

ssize_t __thiscall
cmDebugger::cmDebuggerPipeClient_POSIX::read
          (cmDebuggerPipeClient_POSIX *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  int local_24;
  int count;
  size_t n_local;
  void *buffer_local;
  cmDebuggerPipeClient_POSIX *this_local;
  
  local_24 = 0;
  uVar1 = (**(code **)((long)(this->super_ReaderWriter).super_Reader + 0x10))();
  if ((uVar1 & 1) != 0) {
    sVar2 = ::read(this->rw_pipe,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
    local_24 = (int)sVar2;
    if (local_24 == 0) {
      (**(code **)((long)(this->super_ReaderWriter).super_Reader + 0x18))();
    }
  }
  return (long)local_24;
}

Assistant:

size_t cmDebuggerPipeClient_POSIX::read(void* buffer, size_t n)
{
  int count = 0;
  if (isOpen()) {
    count = static_cast<int>(::read(rw_pipe, buffer, n));
    if (count == 0) {
      close();
    }
  }

  return count;
}